

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageProj
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info)

{
  DiagnosticStream *pDVar1;
  DiagnosticStream local_5b0;
  DiagnosticStream local_3d8;
  DiagnosticStream local_200;
  ImageTypeInfo *local_28;
  ImageTypeInfo *info_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_28 = info;
  info_local = (ImageTypeInfo *)inst;
  inst_local = (Instruction *)_;
  if ((((info->dim == Dim1D) || (info->dim == Dim2D)) || (info->dim == Dim3D)) ||
     (info->dim == Rect)) {
    if (info->multisampled == 0) {
      if (info->arrayed == 0) {
        __local._4_4_ = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag(&local_5b0,_,SPV_ERROR_INVALID_DATA,inst);
        pDVar1 = DiagnosticStream::operator<<
                           (&local_5b0,(char (*) [43])"Expected Image \'arrayed\' parameter to be 0"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar1);
        DiagnosticStream::~DiagnosticStream(&local_5b0);
      }
    }
    else {
      ValidationState_t::diag(&local_3d8,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar1 = DiagnosticStream::operator<<
                         (&local_3d8,(char (*) [38])"Expected Image \'MS\' parameter to be 0");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar1);
      DiagnosticStream::~DiagnosticStream(&local_3d8);
    }
  }
  else {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pDVar1 = DiagnosticStream::operator<<
                       (&local_200,
                        (char (*) [56])"Expected Image \'Dim\' parameter to be 1D, 2D, 3D or Rect");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar1);
    DiagnosticStream::~DiagnosticStream(&local_200);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateImageProj(ValidationState_t& _, const Instruction* inst,
                               const ImageTypeInfo& info) {
  if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
      info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Rect) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image 'Dim' parameter to be 1D, 2D, 3D or Rect";
  }

  if (info.multisampled != 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image 'MS' parameter to be 0";
  }

  if (info.arrayed != 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image 'arrayed' parameter to be 0";
  }

  return SPV_SUCCESS;
}